

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clGetProgramBuildInfo
                 (cl_program program,cl_device_id device,cl_program_build_info param_name,
                 size_t param_value_size,void *param_value,size_t *param_value_size_ret)

{
  time_point tickEnd;
  uint64_t enqueueCounter_00;
  CLIntercept *this;
  bool bVar1;
  cl_int cVar2;
  cl_icd_dispatch *pcVar3;
  SConfig *pSVar4;
  undefined8 uVar5;
  size_t in_RCX;
  cl_program_build_info in_EDX;
  cl_device_id in_RSI;
  cl_program in_RDI;
  void *in_R8;
  size_t *in_R9;
  cl_int retVal;
  char *in_stack_000000c8;
  time_point cpuEnd;
  time_point cpuStart;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 uVar6;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffeb0;
  CLIntercept *in_stack_fffffffffffffeb8;
  allocator *paVar7;
  int local_114 [2];
  cl_int e;
  CEnumNameMap *in_stack_fffffffffffffef8;
  allocator local_f9;
  string local_f8 [24];
  cl_sync_point_khr *in_stack_ffffffffffffff20;
  time_point in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  cl_int errorCode;
  char *in_stack_ffffffffffffff38;
  CLIntercept *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff4f;
  string *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  CLIntercept *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  time_point in_stack_ffffffffffffff70;
  time_point in_stack_ffffffffffffff78;
  time_point in_stack_ffffffffffffff80;
  string local_68 [32];
  uint64_t local_48;
  CLIntercept *local_40;
  size_t *local_38;
  void *local_30;
  size_t local_28;
  cl_program_build_info local_1c;
  cl_device_id local_18;
  cl_program local_10;
  cl_int local_4;
  
  errorCode = (cl_int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  e = (cl_int)((ulong)stack0xfffffffffffffef0 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = GetIntercept();
  if ((local_40 == (CLIntercept *)0x0) ||
     (pcVar3 = CLIntercept::dispatch(local_40),
     pcVar3->clGetProgramBuildInfo == (cl_api_clGetProgramBuildInfo)0x0)) {
    local_114[0] = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_114);
    local_4 = -0x2c;
  }
  else {
    local_48 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffeb8);
    pSVar4 = CLIntercept::config(local_40);
    this = local_40;
    enqueueCounter_00 = local_48;
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::enumName(local_40);
      CEnumNameMap::name_abi_cxx11_(in_stack_fffffffffffffef8,e);
      uVar5 = std::__cxx11::string::c_str();
      CLIntercept::callLoggingEnter
                (this,"clGetProgramBuildInfo",enqueueCounter_00,(cl_kernel)0x0,
                 "param_name = %s (%08X)",uVar5,CONCAT44(uVar6,local_1c));
      std::__cxx11::string::~string(local_68);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffeb0);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffeb0);
    pSVar4 = CLIntercept::config(local_40);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_40), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffff70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffff80.__d.__r = in_stack_ffffffffffffff70.__d.__r;
    }
    pcVar3 = CLIntercept::dispatch(local_40);
    cVar2 = (*pcVar3->clGetProgramBuildInfo)(local_10,local_18,local_1c,local_28,local_30,local_38);
    pSVar4 = CLIntercept::config(local_40);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_40), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffff60 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffff78.__d.__r = (duration)(duration)in_stack_ffffffffffffff60;
      pSVar4 = CLIntercept::config(local_40);
      if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_40,local_48), bVar1)) {
        std::allocator<char>::allocator();
        in_stack_ffffffffffffff28.__d.__r = in_stack_ffffffffffffff78.__d.__r;
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff40,"",(allocator *)&stack0xffffffffffffff3f);
        in_stack_ffffffffffffff78.__d.__r = in_stack_ffffffffffffff28.__d.__r;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffff70.__d.__r,
                   (char *)CONCAT44(cVar2,in_stack_ffffffffffffff68),
                   (string *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff28);
        errorCode = (cl_int)((ulong)in_stack_ffffffffffffff80.__d.__r >> 0x20);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
      }
    }
    pSVar4 = CLIntercept::config(local_40);
    if (((((pSVar4->ErrorLogging & 1U) != 0) ||
         (pSVar4 = CLIntercept::config(local_40), (pSVar4->ErrorAssert & 1U) != 0)) ||
        (pSVar4 = CLIntercept::config(local_40), (pSVar4->NoErrors & 1U) != 0)) && (cVar2 != 0)) {
      pSVar4 = CLIntercept::config(local_40);
      if ((pSVar4->ErrorLogging & 1U) != 0) {
        CLIntercept::logError((CLIntercept *)cpuEnd.__d.__r,in_stack_000000c8,retVal);
      }
      pSVar4 = CLIntercept::config(local_40);
      if ((pSVar4->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar4 = CLIntercept::config(local_40);
      if ((pSVar4->NoErrors & 1U) != 0) {
        cVar2 = 0;
      }
    }
    pSVar4 = CLIntercept::config(local_40);
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,errorCode,
                 (cl_event *)in_stack_ffffffffffffff28.__d.__r,in_stack_ffffffffffffff20);
    }
    pSVar4 = CLIntercept::config(local_40);
    local_4 = cVar2;
    if ((pSVar4->ChromeCallLogging & 1U) != 0) {
      paVar7 = &local_f9;
      std::allocator<char>::allocator();
      unique0x10000603 = (CLIntercept *)in_stack_ffffffffffffff78.__d.__r;
      std::__cxx11::string::string(local_f8,"",paVar7);
      tickEnd.__d.__r._4_4_ = cVar2;
      tickEnd.__d.__r._0_4_ = in_stack_ffffffffffffff68;
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 (bool)in_stack_ffffffffffffff4f,(uint64_t)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff70,tickEnd);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      local_4 = cVar2;
    }
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clGetProgramBuildInfo)(
    cl_program program,
    cl_device_id device,
    cl_program_build_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clGetProgramBuildInfo )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "param_name = %s (%08X)",
            pIntercept->enumName().name( param_name ).c_str(),
            param_name );
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = pIntercept->dispatch().clGetProgramBuildInfo(
            program,
            device,
            param_name,
            param_value_size,
            param_value,
            param_value_size_ret );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        CALL_LOGGING_EXIT( retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_PROGRAM);
}